

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::CampaignManager::CampaignManager(CampaignManager *this,Comm *comm)

{
  int iVar1;
  allocator local_21;
  
  UserOptions::Campaign::Campaign(&this->m_Options);
  this->m_Opened = false;
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  (this->m_Name)._M_string_length = 0;
  (this->m_Name).field_2._M_local_buf[0] = '\0';
  (this->cmap)._M_h._M_buckets = &(this->cmap)._M_h._M_single_bucket;
  (this->cmap)._M_h._M_bucket_count = 1;
  (this->cmap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cmap)._M_h._M_element_count = 0;
  (this->cmap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cmap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cmap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::ofstream::ofstream(&this->m_Output);
  std::__cxx11::string::string((string *)&this->m_CampaignDir,".adios-campaign",&local_21);
  iVar1 = helper::Comm::Rank(comm);
  this->m_WriterRank = iVar1;
  return;
}

Assistant:

CampaignManager::CampaignManager(adios2::helper::Comm &comm) { m_WriterRank = comm.Rank(); }